

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QMimeGlobPattern>::moveAppend
          (QGenericArrayOps<QMimeGlobPattern> *this,QMimeGlobPattern *b,QMimeGlobPattern *e)

{
  QMimeGlobPattern *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  CaseSensitivity CVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QMimeGlobPattern>).ptr;
    qVar6 = (this->super_QArrayDataPointer<QMimeGlobPattern>).size;
    do {
      pDVar2 = (b->m_pattern).d.d;
      (b->m_pattern).d.d = (Data *)0x0;
      pQVar1[qVar6].m_pattern.d.d = pDVar2;
      pcVar3 = (b->m_pattern).d.ptr;
      (b->m_pattern).d.ptr = (char16_t *)0x0;
      pQVar1[qVar6].m_pattern.d.ptr = pcVar3;
      qVar4 = (b->m_pattern).d.size;
      (b->m_pattern).d.size = 0;
      pQVar1[qVar6].m_pattern.d.size = qVar4;
      pDVar2 = (b->m_mimeType).d.d;
      (b->m_mimeType).d.d = (Data *)0x0;
      pQVar1[qVar6].m_mimeType.d.d = pDVar2;
      pcVar3 = (b->m_mimeType).d.ptr;
      (b->m_mimeType).d.ptr = (char16_t *)0x0;
      pQVar1[qVar6].m_mimeType.d.ptr = pcVar3;
      qVar4 = (b->m_mimeType).d.size;
      (b->m_mimeType).d.size = 0;
      pQVar1[qVar6].m_mimeType.d.size = qVar4;
      CVar5 = b->m_caseSensitivity;
      pQVar1[qVar6].m_weight = b->m_weight;
      pQVar1[qVar6].m_caseSensitivity = CVar5;
      pQVar1[qVar6].m_patternType = b->m_patternType;
      b = b + 1;
      qVar6 = (this->super_QArrayDataPointer<QMimeGlobPattern>).size + 1;
      (this->super_QArrayDataPointer<QMimeGlobPattern>).size = qVar6;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }